

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

void __thiscall Fl_Menu_Type::write_code2(Fl_Menu_Type *this)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *local_98;
  char *local_78;
  int local_54;
  int local_50;
  int local_3c;
  int nextlevel;
  int thislevel;
  Fl_Type *q;
  char *mName;
  uint local_20;
  int nLabel;
  int nItem;
  int i;
  Fl_Menu_Item_Type *mi;
  Fl_Menu_Type *this_local;
  
  mi = (Fl_Menu_Item_Type *)this;
  if (((this->super_Fl_Widget_Type).super_Fl_Type.next != (Fl_Type *)0x0) &&
     (iVar1 = (*((this->super_Fl_Widget_Type).super_Fl_Type.next)->_vptr_Fl_Type[0x1e])(),
     iVar1 != 0)) {
    if (i18n_type != 0) {
      _nItem = (this->super_Fl_Widget_Type).super_Fl_Type.next;
      local_20 = 0;
      mName._4_4_ = 0;
      pcVar3 = Fl_Menu_Item_Type::menu_name((Fl_Menu_Item_Type *)_nItem,&nLabel);
      _nextlevel = (this->super_Fl_Widget_Type).super_Fl_Type.next;
      while( true ) {
        bVar6 = false;
        if (_nextlevel != (Fl_Type *)0x0) {
          iVar1 = (*_nextlevel->_vptr_Fl_Type[0x1e])();
          bVar6 = iVar1 != 0;
        }
        if (!bVar6) break;
        pcVar4 = Fl_Type::label(_nextlevel);
        if (pcVar4 != (char *)0x0) {
          mName._4_4_ = mName._4_4_ + 1;
        }
        local_3c = _nextlevel->level;
        iVar1 = (*_nextlevel->_vptr_Fl_Type[0x16])();
        if (iVar1 != 0) {
          local_3c = local_3c + 1;
        }
        if ((_nextlevel->next == (Fl_Type *)0x0) ||
           (iVar1 = (*_nextlevel->next->_vptr_Fl_Type[0x1e])(), iVar1 == 0)) {
          local_50 = ((this->super_Fl_Widget_Type).super_Fl_Type.next)->level + 1;
        }
        else {
          local_50 = _nextlevel->next->level;
        }
        if (local_50 < local_3c) {
          local_54 = local_3c - local_50;
        }
        else {
          local_54 = 0;
        }
        local_20 = local_54 + 1 + local_20;
        _nextlevel = _nextlevel->next;
      }
      if (mName._4_4_ != 0) {
        pcVar4 = indent();
        write_c("%sif (!%s_i18n_done) {\n",pcVar4,pcVar3);
        pcVar4 = indent();
        write_c("%s  int i=0;\n",pcVar4);
        pcVar4 = indent();
        write_c("%s  for ( ; i<%d; i++)\n",pcVar4,(ulong)local_20);
        pcVar4 = indent();
        write_c("%s    if (%s[i].label())\n",pcVar4,pcVar3);
        if (i18n_type == 1) {
          pcVar4 = indent();
          write_c("%s      %s[i].label(%s(%s[i].label()));\n",pcVar4,pcVar3,i18n_function,pcVar3);
        }
        else if (i18n_type == 2) {
          pcVar5 = indent();
          pcVar4 = i18n_set;
          if (*i18n_file == '\0') {
            local_78 = "_catalog";
          }
          else {
            local_78 = i18n_file;
          }
          uVar2 = Fl_Type::msgnum(_nItem);
          write_c("%s      %s[i].label(catgets(%s,%s,i+%d,%s[i].label()));\n",pcVar5,pcVar3,local_78
                  ,pcVar4,(ulong)uVar2,pcVar3);
        }
        pcVar4 = indent();
        write_c("%s  %s_i18n_done = 1;\n",pcVar4,pcVar3);
        pcVar3 = indent();
        write_c("%s}\n",pcVar3);
      }
    }
    pcVar3 = indent();
    pcVar4 = Fl_Type::name((Fl_Type *)this);
    if (pcVar4 == (char *)0x0) {
      local_98 = "o";
    }
    else {
      local_98 = Fl_Type::name((Fl_Type *)this);
    }
    pcVar4 = Fl_Type::name((Fl_Type *)this);
    pcVar5 = Fl_Type::label((Fl_Type *)this);
    pcVar4 = unique_id(this,"menu",pcVar4,pcVar5);
    write_c("%s%s->menu(%s);\n",pcVar3,local_98,pcVar4);
  }
  Fl_Widget_Type::write_code2(&this->super_Fl_Widget_Type);
  return;
}

Assistant:

void Fl_Menu_Type::write_code2() {
  if (next && next->is_menu_item()) {
    if (i18n_type) {
      // take care of i18n now!
      Fl_Menu_Item_Type *mi = (Fl_Menu_Item_Type*)next;
      int i, nItem = 0, nLabel = 0;
      const char *mName = mi->menu_name(i);
      for (Fl_Type* q = next; q && q->is_menu_item(); q = q->next) {
        if (((Fl_Menu_Item_Type*)q)->label()) nLabel++;
	int thislevel = q->level; if (q->is_parent()) thislevel++;
	int nextlevel =
	    (q->next && q->next->is_menu_item()) ? q->next->level : next->level+1;
	nItem += 1 + ((thislevel > nextlevel) ? (thislevel-nextlevel) : 0);
      }
      if (nLabel) {
        write_c("%sif (!%s_i18n_done) {\n", indent(), mName);
        write_c("%s  int i=0;\n", indent());
        write_c("%s  for ( ; i<%d; i++)\n", indent(), nItem);
        write_c("%s    if (%s[i].label())\n", indent(), mName);
        switch (i18n_type) {
          case 1:
            write_c("%s      %s[i].label(%s(%s[i].label()));\n",
                    indent(), mName, i18n_function, mName);
            break;
          case 2:
            write_c("%s      %s[i].label(catgets(%s,%s,i+%d,%s[i].label()));\n",
                    indent(), mName, i18n_file[0] ? i18n_file : "_catalog", 
                    i18n_set, mi->msgnum(), mName);
            break;
        }
        write_c("%s  %s_i18n_done = 1;\n", indent(), mName);
        write_c("%s}\n", indent());
      }
    }
    write_c("%s%s->menu(%s);\n", indent(), name() ? name() : "o",
	    unique_id(this, "menu", name(), label()));
  }
  Fl_Widget_Type::write_code2();
}